

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  ulong __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  cJSON *pcVar4;
  char *pcVar5;
  void *__s_00;
  void *__s_01;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  int fmt_00;
  uint needed;
  cJSON **ppcVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  size_t __n_00;
  int iVar14;
  ulong uVar15;
  
  __n = (ulong)(uint)depth;
  ppcVar10 = &item->child;
  __n_00 = 0xfffffffffffffff8;
  uVar13 = 0;
  pcVar4 = (cJSON *)ppcVar10;
  do {
    pcVar4 = pcVar4->next;
    uVar13 = uVar13 - 1;
    __n_00 = __n_00 + 8;
  } while (pcVar4 != (cJSON *)0x0);
  if ((int)uVar13 == -1) {
    if (p == (printbuffer *)0x0) {
      iVar14 = 3;
      if (fmt != 0) {
        iVar14 = depth + 4;
      }
      pcVar5 = (char *)(*cJSON_malloc)((long)iVar14);
    }
    else {
      iVar14 = 3;
      if (fmt != 0) {
        iVar14 = depth + 4;
      }
      pcVar5 = ensure(p,iVar14);
    }
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '{';
      if (fmt == 0) {
        pcVar7 = pcVar5 + 1;
      }
      else {
        pcVar7 = pcVar5 + 2;
        pcVar5[1] = '\n';
        if (1 < depth) {
          memset(pcVar7,9,(ulong)(depth - 1));
          pcVar7 = pcVar5 + __n + 1;
        }
      }
      pcVar7[0] = '}';
      pcVar7[1] = '\0';
      return pcVar5;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n_00);
    if (__s_00 != (void *)0x0) {
      __s_01 = (*cJSON_malloc)(__n_00);
      if (__s_01 != (void *)0x0) {
        uVar6 = ~uVar13;
        memset(__s_00,0,__n_00);
        memset(__s_01,0,__n_00);
        iVar14 = 7;
        if (fmt != 0) {
          iVar14 = depth + 8;
        }
        pcVar4 = *ppcVar10;
        if (pcVar4 == (cJSON *)0x0) {
LAB_001042cb:
          pcVar5 = (char *)(*cJSON_malloc)((long)iVar14);
          if (pcVar5 != (char *)0x0) {
            *pcVar5 = '{';
            if (fmt == 0) {
              pcVar7 = pcVar5 + 1;
            }
            else {
              pcVar7 = pcVar5 + 2;
              pcVar5[1] = '\n';
            }
            *pcVar7 = '\0';
            uVar15 = 0;
            do {
              if (-1 < depth && fmt != 0) {
                memset(pcVar7,9,(ulong)(depth + 1U));
                pcVar7 = pcVar7 + __n + 1;
              }
              __s = *(char **)((long)__s_01 + uVar15 * 8);
              sVar9 = strlen(__s);
              memcpy(pcVar7,__s,sVar9);
              pcVar7[sVar9] = ':';
              if (fmt == 0) {
                lVar11 = sVar9 + 1;
              }
              else {
                pcVar7[sVar9 + 1] = '\t';
                lVar11 = sVar9 + 2;
              }
              strcpy(pcVar7 + lVar11,*(char **)((long)__s_00 + uVar15 * 8));
              sVar9 = strlen(*(char **)((long)__s_00 + uVar15 * 8));
              pcVar7 = pcVar7 + lVar11 + sVar9;
              if (-(int)uVar13 - 2 != uVar15) {
                *pcVar7 = ',';
                pcVar7 = pcVar7 + 1;
              }
              if (fmt != 0) {
                *pcVar7 = '\n';
                pcVar7 = pcVar7 + 1;
              }
              *pcVar7 = '\0';
              (*cJSON_free)(*(void **)((long)__s_01 + uVar15 * 8));
              (*cJSON_free)(*(void **)((long)__s_00 + uVar15 * 8));
              uVar15 = uVar15 + 1;
            } while (uVar6 != uVar15);
            (*cJSON_free)(__s_01);
            (*cJSON_free)(__s_00);
            if (0 < depth && fmt != 0) {
              memset(pcVar7,9,__n);
              pcVar7 = pcVar7 + __n;
            }
            pcVar7[0] = '}';
            pcVar7[1] = '\0';
            return pcVar5;
          }
        }
        else {
          iVar12 = 2;
          if (fmt != 0) {
            iVar12 = depth + 5;
          }
          bVar1 = true;
          lVar11 = 0;
          do {
            while( true ) {
              lVar11 = lVar11 + 1;
              pcVar5 = print_string_ptr(pcVar4->string,(printbuffer *)0x0);
              *(char **)((long)__s_01 + lVar11 * 8 + -8) = pcVar5;
              pcVar7 = print_value(pcVar4,depth + 1U,fmt,(printbuffer *)0x0);
              *(char **)((long)__s_00 + lVar11 * 8 + -8) = pcVar7;
              if ((pcVar5 == (char *)0x0) || (pcVar7 == (char *)0x0)) break;
              sVar9 = strlen(pcVar7);
              sVar8 = strlen(pcVar5);
              iVar14 = iVar14 + iVar12 + (int)sVar8 + (int)sVar9;
              pcVar4 = pcVar4->next;
              if (pcVar4 == (cJSON *)0x0) {
                if (bVar1) goto LAB_001042cb;
                goto LAB_0010430b;
              }
            }
            pcVar4 = pcVar4->next;
            bVar1 = false;
          } while (pcVar4 != (cJSON *)0x0);
        }
LAB_0010430b:
        lVar11 = 0;
        do {
          if (*(void **)((long)__s_01 + lVar11) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_01 + lVar11));
          }
          if (*(void **)((long)__s_00 + lVar11) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_00 + lVar11));
          }
          lVar11 = lVar11 + 8;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        (*cJSON_free)(__s_01);
      }
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar14 = p->offset;
    pcVar5 = ensure(p,(fmt != 0) + 2);
    if (pcVar5 != (char *)0x0) {
      iVar12 = (fmt != 0) + 1;
      *pcVar5 = '{';
      if (fmt == 0) {
        pcVar5 = pcVar5 + 1;
      }
      else {
        pcVar5[1] = '\n';
        pcVar5 = pcVar5 + 2;
      }
      *pcVar5 = '\0';
      p->offset = p->offset + iVar12;
      pcVar4 = *ppcVar10;
      if (pcVar4 != (cJSON *)0x0) {
        needed = depth + 1;
        do {
          if (fmt != 0) {
            pcVar5 = ensure(p,needed);
            if (pcVar5 == (char *)0x0) {
              return (char *)0x0;
            }
            if (-1 < depth) {
              memset(pcVar5,9,(ulong)needed);
            }
            p->offset = p->offset + needed;
          }
          print_string_ptr(pcVar4->string,p);
          if (p->buffer == (char *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = p->offset;
            sVar9 = strlen(p->buffer + iVar2);
            iVar2 = (int)sVar9 + iVar2;
          }
          p->offset = iVar2;
          pcVar5 = ensure(p,iVar12);
          if (pcVar5 == (char *)0x0) {
            return (char *)0x0;
          }
          iVar2 = 0;
          *pcVar5 = ':';
          if (fmt == 0) {
            iVar3 = 1;
            fmt_00 = 0;
          }
          else {
            pcVar5[1] = '\t';
            iVar3 = 2;
            fmt_00 = fmt;
          }
          p->offset = p->offset + iVar3;
          print_value(pcVar4,needed,fmt_00,p);
          if (p->buffer != (char *)0x0) {
            iVar2 = p->offset;
            sVar9 = strlen(p->buffer + iVar2);
            iVar2 = (int)sVar9 + iVar2;
          }
          p->offset = iVar2;
          iVar2 = ((fmt != 0) + 1) - (uint)(pcVar4->next == (cJSON *)0x0);
          pcVar5 = ensure(p,iVar2 + 1);
          if (pcVar5 == (char *)0x0) {
            return (char *)0x0;
          }
          if (pcVar4->next != (cJSON *)0x0) {
            *pcVar5 = ',';
            pcVar5 = pcVar5 + 1;
          }
          if (fmt != 0) {
            *pcVar5 = '\n';
            pcVar5 = pcVar5 + 1;
          }
          *pcVar5 = '\0';
          p->offset = p->offset + iVar2;
          pcVar4 = pcVar4->next;
        } while (pcVar4 != (cJSON *)0x0);
      }
      iVar12 = 2;
      if (fmt != 0) {
        iVar12 = depth + 2;
      }
      pcVar5 = ensure(p,iVar12);
      if (pcVar5 != (char *)0x0) {
        if (fmt != 0) {
          if (depth < 1) {
            iVar14 = 0;
          }
          else {
            memset(pcVar5,9,__n);
            pcVar5 = pcVar5 + __n;
            iVar14 = depth;
          }
        }
        pcVar5[0] = '}';
        pcVar5[1] = '\0';
        return p->buffer + iVar14;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth-1;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}